

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::pattern_formatter::handle_flag_<spdlog::details::null_scoped_padder>
          (pattern_formatter *this,char flag,padding_info padding)

{
  pointer __p;
  iterator iVar1;
  undefined8 uVar2;
  undefined2 uVar3;
  size_t sVar4;
  char cVar5;
  _Head_base<0UL,_spdlog::details::flag_formatter_*,_false> local_40;
  byte local_31;
  padding_info local_30;
  undefined8 local_20;
  
  uVar2 = padding._8_8_;
  sVar4 = padding.width_;
  local_31 = flag;
  local_30._8_8_ = sVar4;
  local_20 = uVar2;
  iVar1 = std::
          _Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->custom_handlers_)._M_h,(key_type *)&local_31);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    (**(code **)(**(long **)((long)iVar1.
                                   super__Node_iterator_base<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false>
                                   ._M_cur + 0x10) + 0x18))(&local_40);
    local_30.width_ = (size_t)local_40._M_head_impl;
    ((local_40._M_head_impl)->padinfo_).width_ = local_30._8_8_;
    ((local_40._M_head_impl)->padinfo_).side_ = (pad_side)local_20;
    uVar3 = (undefined2)((ulong)local_20 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)uVar3;
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ushort)uVar3 >> 8);
    local_40._M_head_impl = (flag_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    if ((flag_formatter *)local_30.width_ != (flag_formatter *)0x0) {
      (*(*(_func_int ***)local_30.width_)[1])();
    }
    goto LAB_0015eefa;
  }
  switch(local_31) {
  case 0x21:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b6580;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  default:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x38);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)0x0;
    ((local_40._M_head_impl)->padinfo_).width_ = 0;
    ((local_40._M_head_impl)->padinfo_).side_ = left;
    ((local_40._M_head_impl)->padinfo_).truncate_ = false;
    ((local_40._M_head_impl)->padinfo_).enabled_ = false;
    *(undefined2 *)&((local_40._M_head_impl)->padinfo_).field_0xe = 0;
    local_40._M_head_impl[1]._vptr_flag_formatter = (_func_int **)0x0;
    local_40._M_head_impl[1].padinfo_.width_ = 0;
    local_40._M_head_impl[1].padinfo_.side_ = left;
    local_40._M_head_impl[1].padinfo_.truncate_ = false;
    local_40._M_head_impl[1].padinfo_.enabled_ = false;
    *(undefined2 *)&local_40._M_head_impl[1].padinfo_.field_0xe = 0;
    local_40._M_head_impl[2]._vptr_flag_formatter = (_func_int **)0x0;
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__aggregate_formatter_001b66c0
    ;
    cVar5 = (char)local_40._M_head_impl + '\x18';
    local_40._M_head_impl[1]._vptr_flag_formatter =
         (_func_int **)&local_40._M_head_impl[1].padinfo_.side_;
    std::__cxx11::string::push_back(cVar5);
    std::__cxx11::string::push_back(cVar5);
    local_30.width_ = (size_t)local_40._M_head_impl;
    local_40._M_head_impl = (flag_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    if ((flag_formatter *)local_30.width_ != (flag_formatter *)0x0) {
      (*(*(_func_int ***)local_30.width_)[1])();
    }
    if ((aggregate_formatter *)local_40._M_head_impl == (aggregate_formatter *)0x0) {
      return;
    }
    std::default_delete<spdlog::details::aggregate_formatter>::operator()
              ((default_delete<spdlog::details::aggregate_formatter> *)&local_40,
               (aggregate_formatter *)local_40._M_head_impl);
    return;
  case 0x23:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b6540;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x24:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b5a80;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x25:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x20);
    ((local_40._M_head_impl)->padinfo_).width_ = 0;
    *(undefined8 *)((long)&((local_40._M_head_impl)->padinfo_).width_ + 6) = 0;
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b5c00;
    *(undefined1 *)&local_40._M_head_impl[1]._vptr_flag_formatter = 0x25;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x2b:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x140);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__full_formatter_001b52b0;
    local_40._M_head_impl[1]._vptr_flag_formatter = (_func_int **)0x0;
    local_40._M_head_impl[2]._vptr_flag_formatter = (_func_int **)0x0;
    local_40._M_head_impl[1].padinfo_.width_ = (size_t)&PTR_grow_001b42c8;
    *(pad_side **)&local_40._M_head_impl[1].padinfo_.side_ =
         &local_40._M_head_impl[2].padinfo_.side_;
    local_40._M_head_impl[2].padinfo_.width_ = 0xfa;
    local_30.width_ = 0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    if (local_40._M_head_impl == (flag_formatter *)0x0) {
      return;
    }
    (*(local_40._M_head_impl)->_vptr_flag_formatter[1])();
    local_40._M_head_impl = (flag_formatter *)0x0;
    if ((full_formatter *)local_30.width_ == (full_formatter *)0x0) {
      return;
    }
    std::default_delete<spdlog::details::full_formatter>::operator()
              ((default_delete<spdlog::details::full_formatter> *)&local_30,
               (full_formatter *)local_30.width_);
    return;
  case 0x40:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b6480;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x41:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b5ec0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x42:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b5f40;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x43:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b5fc0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x44:
  case 0x78:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b6040;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x45:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b62c0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x46:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b6280;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x48:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b6100;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x49:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b6140;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x4c:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b5dc0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x4d:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b6180;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x4f:
    std::
    make_unique<spdlog::details::elapsed_formatter<spdlog::details::null_scoped_padder,std::chrono::duration<long,std::ratio<1l,1l>>>,spdlog::details::padding_info&>
              (&local_30);
    local_40._M_head_impl = (flag_formatter *)local_30.width_;
    local_30.width_ = 0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_0015f905;
  case 0x50:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b6440;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x52:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b6380;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x53:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b61c0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x54:
  case 0x58:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b63c0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x59:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b6000;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x5e:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b5a40;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x61:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b5e80;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x62:
  case 0x68:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b5f00;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 99:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b5f80;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 100:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b60c0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x65:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b6200;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x66:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b6240;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x67:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b6500;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x69:
    std::
    make_unique<spdlog::details::elapsed_formatter<spdlog::details::null_scoped_padder,std::chrono::duration<long,std::ratio<1l,1000000l>>>,spdlog::details::padding_info&>
              (&local_30);
    local_40._M_head_impl = (flag_formatter *)local_30.width_;
    local_30.width_ = 0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_0015f905;
  case 0x6c:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b5d80;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x6d:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b6080;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x6e:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b5d40;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x6f:
    std::
    make_unique<spdlog::details::elapsed_formatter<spdlog::details::null_scoped_padder,std::chrono::duration<long,std::ratio<1l,1000l>>>,spdlog::details::padding_info&>
              (&local_30);
    local_40._M_head_impl = (flag_formatter *)local_30.width_;
    local_30.width_ = 0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    goto LAB_0015f905;
  case 0x70:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b6300;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x72:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b6340;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x73:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b64c0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x74:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b5e00;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x75:
    std::
    make_unique<spdlog::details::elapsed_formatter<spdlog::details::null_scoped_padder,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,spdlog::details::padding_info&>
              (&local_30);
    local_40._M_head_impl = (flag_formatter *)local_30.width_;
    local_30.width_ = 0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
LAB_0015f905:
    if (local_40._M_head_impl != (flag_formatter *)0x0) {
      (*(local_40._M_head_impl)->_vptr_flag_formatter[1])();
    }
    local_40._M_head_impl = (flag_formatter *)0x0;
    if ((void *)local_30.width_ == (void *)0x0) {
      return;
    }
    operator_delete((void *)local_30.width_,0x20);
    return;
  case 0x76:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b5e40;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    break;
  case 0x7a:
    local_40._M_head_impl = (flag_formatter *)operator_new(0x28);
    ((local_40._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_40._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_40._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar2 >> 0x20);
    ((local_40._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar2 >> 0x28);
    *(short *)&((local_40._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar2 >> 0x30);
    (local_40._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b6400;
    local_40._M_head_impl[1]._vptr_flag_formatter = (_func_int **)0x0;
    *(undefined4 *)&local_40._M_head_impl[1].padinfo_.width_ = 0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
  }
LAB_0015eefa:
  if (local_40._M_head_impl != (flag_formatter *)0x0) {
    (*(local_40._M_head_impl)->_vptr_flag_formatter[1])();
  }
  return;
}

Assistant:

SPDLOG_INLINE void pattern_formatter::handle_flag_(char flag, details::padding_info padding)
{
    // process custom flags
    auto it = custom_handlers_.find(flag);
    if (it != custom_handlers_.end())
    {
        auto custom_handler = it->second->clone();
        custom_handler->set_padding_info(padding);
        formatters_.push_back(std::move(custom_handler));
        return;
    }

    // process built-in flags
    switch (flag)
    {
    case ('+'): // default formatter
        formatters_.push_back(details::make_unique<details::full_formatter>(padding));
        break;

    case 'n': // logger name
        formatters_.push_back(details::make_unique<details::name_formatter<Padder>>(padding));
        break;

    case 'l': // level
        formatters_.push_back(details::make_unique<details::level_formatter<Padder>>(padding));
        break;

    case 'L': // short level
        formatters_.push_back(details::make_unique<details::short_level_formatter<Padder>>(padding));
        break;

    case ('t'): // thread id
        formatters_.push_back(details::make_unique<details::t_formatter<Padder>>(padding));
        break;

    case ('v'): // the message text
        formatters_.push_back(details::make_unique<details::v_formatter<Padder>>(padding));
        break;

    case ('a'): // weekday
        formatters_.push_back(details::make_unique<details::a_formatter<Padder>>(padding));
        break;

    case ('A'): // short weekday
        formatters_.push_back(details::make_unique<details::A_formatter<Padder>>(padding));
        break;

    case ('b'):
    case ('h'): // month
        formatters_.push_back(details::make_unique<details::b_formatter<Padder>>(padding));
        break;

    case ('B'): // short month
        formatters_.push_back(details::make_unique<details::B_formatter<Padder>>(padding));
        break;

    case ('c'): // datetime
        formatters_.push_back(details::make_unique<details::c_formatter<Padder>>(padding));
        break;

    case ('C'): // year 2 digits
        formatters_.push_back(details::make_unique<details::C_formatter<Padder>>(padding));
        break;

    case ('Y'): // year 4 digits
        formatters_.push_back(details::make_unique<details::Y_formatter<Padder>>(padding));
        break;

    case ('D'):
    case ('x'): // datetime MM/DD/YY
        formatters_.push_back(details::make_unique<details::D_formatter<Padder>>(padding));
        break;

    case ('m'): // month 1-12
        formatters_.push_back(details::make_unique<details::m_formatter<Padder>>(padding));
        break;

    case ('d'): // day of month 1-31
        formatters_.push_back(details::make_unique<details::d_formatter<Padder>>(padding));
        break;

    case ('H'): // hours 24
        formatters_.push_back(details::make_unique<details::H_formatter<Padder>>(padding));
        break;

    case ('I'): // hours 12
        formatters_.push_back(details::make_unique<details::I_formatter<Padder>>(padding));
        break;

    case ('M'): // minutes
        formatters_.push_back(details::make_unique<details::M_formatter<Padder>>(padding));
        break;

    case ('S'): // seconds
        formatters_.push_back(details::make_unique<details::S_formatter<Padder>>(padding));
        break;

    case ('e'): // milliseconds
        formatters_.push_back(details::make_unique<details::e_formatter<Padder>>(padding));
        break;

    case ('f'): // microseconds
        formatters_.push_back(details::make_unique<details::f_formatter<Padder>>(padding));
        break;

    case ('F'): // nanoseconds
        formatters_.push_back(details::make_unique<details::F_formatter<Padder>>(padding));
        break;

    case ('E'): // seconds since epoch
        formatters_.push_back(details::make_unique<details::E_formatter<Padder>>(padding));
        break;

    case ('p'): // am/pm
        formatters_.push_back(details::make_unique<details::p_formatter<Padder>>(padding));
        break;

    case ('r'): // 12 hour clock 02:55:02 pm
        formatters_.push_back(details::make_unique<details::r_formatter<Padder>>(padding));
        break;

    case ('R'): // 24-hour HH:MM time
        formatters_.push_back(details::make_unique<details::R_formatter<Padder>>(padding));
        break;

    case ('T'):
    case ('X'): // ISO 8601 time format (HH:MM:SS)
        formatters_.push_back(details::make_unique<details::T_formatter<Padder>>(padding));
        break;

    case ('z'): // timezone
        formatters_.push_back(details::make_unique<details::z_formatter<Padder>>(padding));
        break;

    case ('P'): // pid
        formatters_.push_back(details::make_unique<details::pid_formatter<Padder>>(padding));
        break;

    case ('^'): // color range start
        formatters_.push_back(details::make_unique<details::color_start_formatter>(padding));
        break;

    case ('$'): // color range end
        formatters_.push_back(details::make_unique<details::color_stop_formatter>(padding));
        break;

    case ('@'): // source location (filename:filenumber)
        formatters_.push_back(details::make_unique<details::source_location_formatter<Padder>>(padding));
        break;

    case ('s'): // short source filename - without directory name
        formatters_.push_back(details::make_unique<details::short_filename_formatter<Padder>>(padding));
        break;

    case ('g'): // full source filename
        formatters_.push_back(details::make_unique<details::source_filename_formatter<Padder>>(padding));
        break;

    case ('#'): // source line number
        formatters_.push_back(details::make_unique<details::source_linenum_formatter<Padder>>(padding));
        break;

    case ('!'): // source funcname
        formatters_.push_back(details::make_unique<details::source_funcname_formatter<Padder>>(padding));
        break;

    case ('%'): // % char
        formatters_.push_back(details::make_unique<details::ch_formatter>('%'));
        break;

    case ('u'): // elapsed time since last log message in nanos
        formatters_.push_back(details::make_unique<details::elapsed_formatter<Padder, std::chrono::nanoseconds>>(padding));
        break;

    case ('i'): // elapsed time since last log message in micros
        formatters_.push_back(details::make_unique<details::elapsed_formatter<Padder, std::chrono::microseconds>>(padding));
        break;

    case ('o'): // elapsed time since last log message in millis
        formatters_.push_back(details::make_unique<details::elapsed_formatter<Padder, std::chrono::milliseconds>>(padding));
        break;

    case ('O'): // elapsed time since last log message in seconds
        formatters_.push_back(details::make_unique<details::elapsed_formatter<Padder, std::chrono::seconds>>(padding));
        break;

    default: // Unknown flag appears as is
        auto unknown_flag = details::make_unique<details::aggregate_formatter>();
        unknown_flag->add_ch('%');
        unknown_flag->add_ch(flag);
        formatters_.push_back((std::move(unknown_flag)));
        break;
    }
}